

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BgzfStream_p.cpp
# Opt level: O3

bool BamTools::Internal::BgzfStream::CheckBlockHeader(char *header)

{
  if ((((*header == '\x1f') && (header[1] == -0x75)) && (header[2] == '\b')) &&
     ((((header[3] & 4U) != 0 && (*(short *)(header + 10) == 6)) &&
      ((header[0xc] == 'B' && (header[0xd] == 'C')))))) {
    return *(short *)(header + 0xe) == 2;
  }
  return false;
}

Assistant:

bool BgzfStream::CheckBlockHeader(char* header)
{
    return (header[0] == Constants::GZIP_ID1 && header[1] == Constants::GZIP_ID2 &&
            header[2] == Z_DEFLATED && (header[3] & Constants::FLG_FEXTRA) != 0 &&
            BamTools::UnpackUnsignedShort(&header[10]) == Constants::BGZF_XLEN &&
            header[12] == Constants::BGZF_ID1 && header[13] == Constants::BGZF_ID2 &&
            BamTools::UnpackUnsignedShort(&header[14]) == Constants::BGZF_LEN);
}